

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::SemanticAnalyser(SemanticAnalyser *this)

{
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__SemanticAnalyser_00148f90;
  SymbolTable::SymbolTable(&this->symbols_);
  std::
  stack<SemanticAnalyser::ReturnInfo,std::deque<SemanticAnalyser::ReturnInfo,std::allocator<SemanticAnalyser::ReturnInfo>>>
  ::
  stack<std::deque<SemanticAnalyser::ReturnInfo,std::allocator<SemanticAnalyser::ReturnInfo>>,void>
            (&this->hasReturn_);
  addBuildInSymbols(this);
  return;
}

Assistant:

SemanticAnalyser::SemanticAnalyser(): symbols_(), hasReturn_()
{
  addBuildInSymbols();
}